

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void align_text_image_cb(Fl_Choice *i,void *v)

{
  bool bVar1;
  int iVar2;
  Fl_Align FVar3;
  uint alignment;
  long lVar4;
  Fl_Menu_Item *pFVar5;
  void *pvVar6;
  Fl_Align y;
  Fl_Align x;
  Fl_Widget_Type *q;
  Fl_Type *o;
  int mod;
  Fl_Align b_1;
  Fl_Menu_Item *mi_1;
  Fl_Menu_Item *pFStack_20;
  Fl_Align b;
  Fl_Menu_Item *mi;
  void *v_local;
  Fl_Choice *i_local;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
    if (iVar2 == 0) {
      Fl_Widget::activate((Fl_Widget *)i);
      pFStack_20 = Fl_Menu_::menu(&i->super_Fl_Menu_);
      FVar3 = Fl_Widget::align(current_widget->o);
      for (; pFStack_20->text != (char *)0x0; pFStack_20 = pFStack_20 + 1) {
        lVar4 = Fl_Menu_Item::argument(pFStack_20);
        if ((uint)lVar4 == (FVar3 & 800)) {
          Fl_Choice::value(i,pFStack_20);
        }
      }
    }
    else {
      Fl_Widget::deactivate((Fl_Widget *)i);
    }
  }
  else {
    pFVar5 = Fl_Menu_::menu(&i->super_Fl_Menu_);
    iVar2 = Fl_Choice::value(i);
    pvVar6 = Fl_Menu_Item::user_data(pFVar5 + iVar2);
    bVar1 = false;
    for (q = (Fl_Widget_Type *)Fl_Type::first; q != (Fl_Widget_Type *)0x0;
        q = (Fl_Widget_Type *)(q->super_Fl_Type).next) {
      if (((q->super_Fl_Type).selected != '\0') &&
         (iVar2 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar2 != 0)) {
        FVar3 = Fl_Widget::align(q->o);
        alignment = FVar3 & 0xfffffcdf | (uint)pvVar6;
        if (FVar3 != alignment) {
          Fl_Widget::align(q->o,alignment);
          Fl_Widget_Type::redraw(q);
          bVar1 = true;
        }
      }
    }
    if (bVar1) {
      set_modflag(1);
    }
  }
  return;
}

Assistant:

void align_text_image_cb(Fl_Choice *i, void *v) {
  if (v == LOAD) {
    if (current_widget->is_menu_item()) {i->deactivate(); return;} else i->activate();
    Fl_Menu_Item *mi = (Fl_Menu_Item*)i->menu();
    Fl_Align b = current_widget->o->align() & FL_ALIGN_IMAGE_MASK;
    for (;mi->text;mi++) {
      if ((Fl_Align)(mi->argument())==b)
        i->value(mi);
    }
  } else {
    const Fl_Menu_Item *mi = i->menu() + i->value();
    Fl_Align b = Fl_Align(fl_uintptr_t(mi->user_data()));
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	Fl_Align x = q->o->align();
	Fl_Align y = (x & ~FL_ALIGN_IMAGE_MASK) | b;
	if (x != y) {
          q->o->align(y);
	  q->redraw();
	  mod = 1;
	}
      }
    }
    if (mod) set_modflag(1);
  }
}